

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  uint uVar1;
  TypeInfo *pTVar2;
  Descriptor *this_00;
  DynamicMessageFactory *this_01;
  bool bVar3;
  CppStringType CVar4;
  int32_t iVar5;
  long lVar6;
  FieldDescriptor *field;
  Descriptor *pDVar7;
  FieldDescriptor *this_02;
  Descriptor *type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EnumValueDescriptor *pEVar8;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar9;
  Message *default_entry;
  Message *mapped_default_entry_if_message;
  int iVar10;
  int iVar11;
  code *cleanup;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *this_03;
  int i;
  string_view src;
  ThreadSafeArena *local_50;
  
  local_50 = (ThreadSafeArena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pTVar2 = this->type_info_;
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(ThreadSafeArena **)((ulong)local_50 & 0xfffffffffffffffe);
  }
  this_00 = (pTVar2->class_data).descriptor;
  iVar10 = 0;
  for (iVar11 = 0; iVar11 < this_00->real_oneof_decl_count_; iVar11 = iVar11 + 1) {
    *(undefined4 *)
     ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
     (long)(pTVar2->oneof_case_offset + iVar10)) = 0;
    iVar10 = iVar10 + 4;
  }
  lVar6 = (long)pTVar2->extensions_offset;
  if (lVar6 != -1) {
    *(ThreadSafeArena **)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar6)
         = local_50;
    *(undefined4 *)((long)&(this->super_Message).super_MessageLite._internal_metadata_.ptr_ + lVar6)
         = 0;
    *(undefined8 *)((long)&this->type_info_ + lVar6) = 0;
  }
  lVar6 = 0;
  do {
    if (this_00->field_count_ <= lVar6) {
      return;
    }
    field = Descriptor::field(this_00,(int)lVar6);
    uVar1 = (this->type_info_->offsets)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar6];
    bVar3 = protobuf::anon_unknown_0::InRealOneof(field);
    if ((!bVar3) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) - 1U < 10)) {
      this_03 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1
                );
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
      case 1:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) goto LAB_00c4f4f0;
LAB_00c4f4ba:
        iVar5 = (field->field_20).default_value_int32_t_;
LAB_00c4f5f5:
        this_03->default_value_int32_t_ = iVar5;
        break;
      case 2:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          RepeatedField<long>::RepeatedField
                    ((RepeatedField<long> *)&this_03->default_generated_instance_,(Arena *)local_50)
          ;
        }
        else {
LAB_00c4f520:
          aVar9 = field->field_20;
LAB_00c4f524:
          this_03->default_value_double_ = (double)aVar9;
        }
        break;
      case 3:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (!bVar3) goto LAB_00c4f4ba;
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)&this_03->default_generated_instance_,
                   (Arena *)local_50);
        break;
      case 4:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (!bVar3) goto LAB_00c4f520;
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)&this_03->default_generated_instance_,
                   (Arena *)local_50);
        break;
      case 5:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          RepeatedField<double>::RepeatedField
                    ((RepeatedField<double> *)&this_03->default_generated_instance_,
                     (Arena *)local_50);
        }
        else {
          *this_03 = field->field_20;
        }
        break;
      case 6:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          RepeatedField<float>::RepeatedField
                    ((RepeatedField<float> *)&this_03->default_generated_instance_,(Arena *)local_50
                    );
        }
        else {
          this_03->default_value_int32_t_ = (field->field_20).default_value_int32_t_;
        }
        break;
      case 7:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          RepeatedField<bool>::RepeatedField
                    ((RepeatedField<bool> *)&this_03->default_generated_instance_,(Arena *)local_50)
          ;
        }
        else {
          this_03->default_value_bool_ = (field->field_20).default_value_bool_;
        }
        break;
      case 8:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (!bVar3) {
          pEVar8 = FieldDescriptor::default_value_enum(field);
          iVar5 = pEVar8->number_;
          goto LAB_00c4f5f5;
        }
LAB_00c4f4f0:
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)&this_03->default_generated_instance_,(Arena *)local_50);
        break;
      case 9:
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if ((CVar4 == kView) || (CVar4 == kString)) {
          bVar3 = FieldDescriptor::is_repeated(field);
          if (!bVar3) {
            aVar9.default_value_double_ = (double)&internal::fixed_address_empty_string;
            goto LAB_00c4f524;
          }
LAB_00c4f618:
          this_03->default_value_int64_t_ = 0;
          this_03[1].default_value_int64_t_ = 0;
          this_03[2].default_value_enum_ = (EnumValueDescriptor *)local_50;
        }
        else if (CVar4 == kCord) {
          bVar3 = FieldDescriptor::is_repeated(field);
          if (bVar3) {
            internal::ShortSooRep::ShortSooRep
                      ((ShortSooRep *)&this_03->default_generated_instance_,(Arena *)local_50);
            if (local_50 != (ThreadSafeArena *)0x0) {
              cleanup = internal::cleanup::
                        arena_destruct_object<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
              ;
LAB_00c4f6c4:
              internal::ThreadSafeArena::AddCleanup(local_50,this_03,cleanup);
            }
          }
          else {
            if ((field->field_0x1 & 1) == 0) {
              this_03->default_value_int64_t_ = 0;
              this_03[1].default_value_int64_t_ = 0;
            }
            else {
              src._M_str = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
              src._M_len = ((field->field_20).default_value_string_)->_M_string_length;
              absl::lts_20250127::Cord::Cord((Cord *)&this_03->default_generated_instance_,src);
            }
            if (local_50 != (ThreadSafeArena *)0x0) {
              cleanup = internal::cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
              goto LAB_00c4f6c4;
            }
          }
        }
        break;
      case 10:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          bVar3 = FieldDescriptor::is_map(field);
          if (!bVar3) goto LAB_00c4f618;
          pDVar7 = FieldDescriptor::message_type(field);
          this_02 = Descriptor::map_value(pDVar7);
          pDVar7 = FieldDescriptor::message_type(this_02);
          this_01 = this->type_info_->factory;
          type = FieldDescriptor::message_type(field);
          if (lock_factory) {
            iVar10 = (*(this_01->super_MessageFactory)._vptr_MessageFactory[2])(this_01,type);
            default_entry = (Message *)CONCAT44(extraout_var,iVar10);
            if (pDVar7 == (Descriptor *)0x0) {
LAB_00c4f68b:
              mapped_default_entry_if_message = (Message *)0x0;
            }
            else {
              iVar10 = (*(this->type_info_->factory->super_MessageFactory)._vptr_MessageFactory[2])
                                 ();
              mapped_default_entry_if_message = (Message *)CONCAT44(extraout_var_00,iVar10);
            }
          }
          else {
            default_entry = DynamicMessageFactory::GetPrototypeNoLock(this_01,type);
            if (pDVar7 == (Descriptor *)0x0) goto LAB_00c4f68b;
            mapped_default_entry_if_message =
                 DynamicMessageFactory::GetPrototypeNoLock(this->type_info_->factory,pDVar7);
          }
          internal::DynamicMapField::DynamicMapField
                    ((DynamicMapField *)&this_03->default_generated_instance_,default_entry,
                     mapped_default_entry_if_message,(Arena *)local_50);
        }
        else {
          this_03->default_value_int64_t_ = 0;
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->class_data.descriptor;
  Arena* arena = GetArena();
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->real_oneof_decl_count(); ++i) {
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(arena);
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                         \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                 \
    if (!field->is_repeated()) {                           \
      new (field_ptr) TYPE(field->default_value_##TYPE()); \
    } else {                                               \
      new (field_ptr) RepeatedField<TYPE>(arena);          \
    }                                                      \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(arena);
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            if (!field->is_repeated()) {
              if (field->has_default_value()) {
                new (field_ptr) absl::Cord(field->default_value_string());
              } else {
                new (field_ptr) absl::Cord;
              }
              if (arena != nullptr) {
                // Cord does not support arena so here we need to notify arena
                // to remove the data it allocated on the heap by calling its
                // destructor.
                arena->OwnDestructor(static_cast<absl::Cord*>(field_ptr));
              }
            } else {
              new (field_ptr) RepeatedField<absl::Cord>(arena);
              if (arena != nullptr) {
                // Needs to destroy Cord elements.
                arena->OwnDestructor(
                    static_cast<RepeatedField<absl::Cord>*>(field_ptr));
              }
            }
            break;
          case FieldDescriptor::CppStringType::kView:
            if (internal::EnableExperimentalMicroString() &&
                !field->is_repeated()) {
              auto* str = ::new (MutableRaw<MicroString>(i)) MicroString();
              if (field->has_default_value()) {
                // TODO: Use an unowned block instead.
                str->Set(field->default_value_string(), arena);
              }
              break;
            }
            [[fallthrough]];
          case FieldDescriptor::CppStringType::kString:
            if (!field->is_repeated()) {
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->InitDefault();
            } else {
              new (field_ptr) RepeatedPtrField<std::string>(arena);
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            const auto* sub =
                field->message_type()->map_value()->message_type();
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            new (field_ptr) DynamicMapField(
                lock_factory
                    ? type_info_->factory->GetPrototype(field->message_type())
                    : type_info_->factory->GetPrototypeNoLock(
                          field->message_type()),
                sub != nullptr
                    ? lock_factory
                          ? type_info_->factory->GetPrototype(sub)
                          : type_info_->factory->GetPrototypeNoLock(sub)
                    : nullptr,
                arena);
          } else {
            new (field_ptr) RepeatedPtrField<Message>(arena);
          }
        }
        break;
      }
    }
  }
}